

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_internal.h
# Opt level: O0

U32 ZSTD_window_correctOverflow(ZSTD_window_t *window,U32 cycleLog,U32 maxDist,void *src)

{
  uint uVar1;
  U32 correction;
  U32 newCurrent;
  U32 current;
  U32 cycleMask;
  void *src_local;
  U32 maxDist_local;
  U32 cycleLog_local;
  ZSTD_window_t *window_local;
  
  uVar1 = (int)src - (int)window->base;
  uVar1 = uVar1 - ((uVar1 & (1 << ((byte)cycleLog & 0x1f)) - 1U) + maxDist);
  window->base = window->base + uVar1;
  window->dictBase = window->dictBase + uVar1;
  window->lowLimit = window->lowLimit - uVar1;
  window->dictLimit = window->dictLimit - uVar1;
  return uVar1;
}

Assistant:

MEM_STATIC U32 ZSTD_window_correctOverflow(ZSTD_window_t* window, U32 cycleLog,
                                           U32 maxDist, void const* src)
{
    /* preemptive overflow correction:
     * 1. correction is large enough:
     *    lowLimit > (3<<29) ==> current > 3<<29 + 1<<windowLog
     *    1<<windowLog <= newCurrent < 1<<chainLog + 1<<windowLog
     *
     *    current - newCurrent
     *    > (3<<29 + 1<<windowLog) - (1<<windowLog + 1<<chainLog)
     *    > (3<<29) - (1<<chainLog)
     *    > (3<<29) - (1<<30)             (NOTE: chainLog <= 30)
     *    > 1<<29
     *
     * 2. (ip+ZSTD_CHUNKSIZE_MAX - cctx->base) doesn't overflow:
     *    After correction, current is less than (1<<chainLog + 1<<windowLog).
     *    In 64-bit mode we are safe, because we have 64-bit ptrdiff_t.
     *    In 32-bit mode we are safe, because (chainLog <= 29), so
     *    ip+ZSTD_CHUNKSIZE_MAX - cctx->base < 1<<32.
     * 3. (cctx->lowLimit + 1<<windowLog) < 1<<32:
     *    windowLog <= 31 ==> 3<<29 + 1<<windowLog < 7<<29 < 1<<32.
     */
    U32 const cycleMask = (1U << cycleLog) - 1;
    U32 const current = (U32)((BYTE const*)src - window->base);
    U32 const newCurrent = (current & cycleMask) + maxDist;
    U32 const correction = current - newCurrent;
    assert((maxDist & cycleMask) == 0);
    assert(current > newCurrent);
    /* Loose bound, should be around 1<<29 (see above) */
    assert(correction > 1<<28);

    window->base += correction;
    window->dictBase += correction;
    window->lowLimit -= correction;
    window->dictLimit -= correction;

    DEBUGLOG(4, "Correction of 0x%x bytes to lowLimit=0x%x", correction,
             window->lowLimit);
    return correction;
}